

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O0

ps_seg_t * kws_seg_next(ps_seg_t *seg)

{
  int iVar1;
  kws_seg_t *itor;
  ps_seg_t *seg_local;
  
  iVar1 = *(int *)&seg[1].text + 1;
  *(int *)&seg[1].text = iVar1;
  if (iVar1 == *(int *)((long)&seg[1].search + 4)) {
    kws_seg_free(seg);
    seg_local = (ps_seg_t *)0x0;
  }
  else {
    kws_seg_fill((kws_seg_t *)seg);
    seg_local = seg;
  }
  return seg_local;
}

Assistant:

static ps_seg_t *
kws_seg_next(ps_seg_t *seg)
{
    kws_seg_t *itor = (kws_seg_t *)seg;

    if (++itor->pos == itor->n_detections) {
        kws_seg_free(seg);
        return NULL;
    }

    kws_seg_fill(itor);

    return seg;
}